

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

int Bmcs_ManUnfold_rec(Bmcs_Man_t *p,int iObj,int f)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int iNew;
  int *pCopies;
  int iLit;
  Gia_Obj_t *pObj;
  int f_local;
  int iObj_local;
  Bmcs_Man_t *p_local;
  
  pCopies._4_4_ = 0;
  piVar3 = Bmcs_ManCopies(p,f);
  if (piVar3[iObj] < 0) {
    pGVar4 = Gia_ManObj(p->pGia,iObj);
    iVar1 = Gia_ObjIsCi(pGVar4);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pGVar4);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                      ,0x1d0,"int Bmcs_ManUnfold_rec(Bmcs_Man_t *, int, int)");
      }
      iVar1 = Gia_ObjFaninId0(pGVar4,iObj);
      iVar1 = Bmcs_ManUnfold_rec(p,iVar1,f);
      iVar2 = Gia_ObjFaninC0(pGVar4);
      pCopies._4_4_ = Abc_LitNotCond(iVar1,iVar2);
      if (0 < pCopies._4_4_) {
        iVar1 = Gia_ObjFaninId1(pGVar4,iObj);
        iVar1 = Bmcs_ManUnfold_rec(p,iVar1,f);
        iVar2 = Gia_ObjFaninC1(pGVar4);
        iVar1 = Abc_LitNotCond(iVar1,iVar2);
        pCopies._4_4_ = Gia_ManHashAnd(p->pFrames,pCopies._4_4_,iVar1);
      }
    }
    else {
      iVar1 = Gia_ObjIsPi(p->pGia,pGVar4);
      if (iVar1 == 0) {
        if (0 < f) {
          pGVar4 = Gia_ObjRoToRi(p->pGia,pGVar4);
          iVar1 = Gia_ObjFaninId0p(p->pGia,pGVar4);
          iVar1 = Bmcs_ManUnfold_rec(p,iVar1,f + -1);
          iVar2 = Gia_ObjFaninC0(pGVar4);
          pCopies._4_4_ = Abc_LitNotCond(iVar1,iVar2);
        }
      }
      else {
        iVar1 = Gia_ObjCioId(pGVar4);
        Vec_IntPushTwo(&p->vCiMap,iVar1,f);
        pCopies._4_4_ = Gia_ManAppendCi(p->pFrames);
      }
    }
    piVar3[iObj] = pCopies._4_4_;
    p_local._4_4_ = pCopies._4_4_;
  }
  else {
    p_local._4_4_ = piVar3[iObj];
  }
  return p_local._4_4_;
}

Assistant:

int Bmcs_ManUnfold_rec( Bmcs_Man_t * p, int iObj, int f )
{
    Gia_Obj_t * pObj; 
    int iLit = 0, * pCopies = Bmcs_ManCopies( p, f );
    if ( pCopies[iObj] >= 0 )
        return pCopies[iObj];
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            Vec_IntPushTwo( &p->vCiMap, Gia_ObjCioId(pObj), f );
            iLit = Gia_ManAppendCi( p->pFrames );
        }
        else if ( f > 0 )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            iLit = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f-1 );
            iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        }
    }
    else if ( Gia_ObjIsAnd(pObj) )
    {
        iLit = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId0(pObj, iObj), f );
        iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        if ( iLit > 0 )
        {
            int iNew;
            iNew = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId1(pObj, iObj), f );
            iNew = Abc_LitNotCond( iNew, Gia_ObjFaninC1(pObj) );
            iLit = Gia_ManHashAnd( p->pFrames, iLit, iNew );
        }
    }
    else assert( 0 );
    return (pCopies[iObj] = iLit);
}